

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O3

void hralg(double *x,int N,int p,int q,double *phi,double *theta,double *var)

{
  uint rows;
  long lVar1;
  double *x_00;
  long lVar2;
  double *phi_00;
  void *__s;
  double *sig;
  double *col;
  double *C;
  double *C_00;
  double *x_01;
  int *ipiv;
  ulong uVar3;
  int cols;
  int iVar4;
  long lVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  uint p_00;
  size_t sVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  uVar15 = (ulong)(uint)p;
  lVar1 = (long)N;
  x_00 = (double *)malloc(lVar1 * 8);
  iVar4 = q;
  if (q < p) {
    iVar4 = p;
  }
  cols = q + p;
  p_00 = 10;
  if (N <= q + p + 0x14) {
    p_00 = iVar4 + 1U;
  }
  if (9 < iVar4) {
    p_00 = iVar4 + 1U;
  }
  lVar2 = (long)(int)p_00;
  phi_00 = (double *)malloc(lVar2 * 8);
  __s = malloc(lVar1 * 8);
  iVar4 = p_00 + q;
  rows = N - iVar4;
  lVar9 = (long)cols;
  sVar14 = (int)rows * lVar9 * 8;
  sig = (double *)malloc(sVar14);
  col = (double *)malloc(sVar14);
  sVar14 = lVar9 * 8;
  C = (double *)malloc(sVar14 * lVar9);
  C_00 = (double *)malloc(sVar14);
  x_01 = (double *)malloc(sVar14);
  ipiv = (int *)malloc(lVar9 << 2);
  dVar16 = mean(x,N);
  if (N < 1) {
    ywalg(x_00,N,p_00,phi_00);
  }
  else {
    uVar3 = 0;
    do {
      x_00[uVar3] = x[uVar3] - dVar16;
      uVar3 = uVar3 + 1;
    } while ((uint)N != uVar3);
    ywalg(x_00,N,p_00,phi_00);
    if (0 < N) {
      memset(__s,0,(ulong)(uint)N << 3);
    }
  }
  if ((int)p_00 < N) {
    lVar5 = (lVar2 << 0x20) + -0x100000000;
    lVar8 = lVar2;
    do {
      dVar16 = x_00[lVar8];
      *(double *)((long)__s + lVar8 * 8) = dVar16;
      if (0 < (int)p_00) {
        uVar3 = 0;
        lVar10 = lVar5;
        do {
          dVar16 = dVar16 - phi_00[uVar3] * *(double *)((long)x_00 + (lVar10 >> 0x1d));
          uVar3 = uVar3 + 1;
          lVar10 = lVar10 + -0x100000000;
        } while (p_00 != uVar3);
        *(double *)((long)__s + lVar8 * 8) = dVar16;
      }
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x100000000;
    } while (lVar8 != lVar1);
  }
  if (0 < (int)rows) {
    pdVar6 = sig + p;
    iVar7 = p_00 + q + -1;
    uVar3 = 0;
    pdVar11 = sig;
    do {
      if (0 < p) {
        uVar13 = 0;
        iVar12 = iVar7;
        do {
          pdVar11[uVar13] = x_00[iVar12];
          uVar13 = uVar13 + 1;
          iVar12 = iVar12 + -1;
        } while (uVar15 != uVar13);
      }
      if (0 < q) {
        uVar13 = 0;
        iVar12 = iVar7;
        do {
          pdVar6[uVar13] = -*(double *)((long)__s + (long)iVar12 * 8);
          uVar13 = uVar13 + 1;
          iVar12 = iVar12 + -1;
        } while ((uint)q != uVar13);
      }
      uVar3 = uVar3 + 1;
      pdVar11 = pdVar11 + lVar9;
      iVar7 = iVar7 + 1;
      pdVar6 = pdVar6 + lVar9;
    } while (uVar3 != rows);
  }
  mtranspose(sig,rows,cols,col);
  mmult(col,sig,C,cols,rows,cols);
  mmult(col,x_00 + lVar2 + q,C_00,cols,rows,1);
  ludecomp(C,cols,ipiv);
  linsolve(C,cols,C_00,ipiv,x_01);
  if (0 < p) {
    memcpy(phi,x_01,uVar15 * 8);
  }
  if (0 < q) {
    iVar7 = p + 1;
    if (p + 1 < cols) {
      iVar7 = cols;
    }
    memcpy(theta,x_01 + p,(ulong)(uint)(~p + iVar7) * 8 + 8);
  }
  dVar16 = 0.0;
  if (iVar4 < N) {
    lVar2 = (long)iVar4;
    lVar9 = (lVar2 << 0x20) + -0x100000000;
    do {
      dVar17 = x_00[lVar2];
      if (0 < p) {
        uVar3 = 0;
        lVar8 = lVar9;
        do {
          dVar17 = dVar17 - phi[uVar3] * *(double *)((long)x_00 + (lVar8 >> 0x1d));
          uVar3 = uVar3 + 1;
          lVar8 = lVar8 + -0x100000000;
        } while (uVar15 != uVar3);
      }
      if (0 < q) {
        uVar3 = 0;
        lVar8 = lVar9;
        do {
          dVar17 = dVar17 + theta[uVar3] * *(double *)((long)__s + (lVar8 >> 0x1d));
          uVar3 = uVar3 + 1;
          lVar8 = lVar8 + -0x100000000;
        } while ((uint)q != uVar3);
      }
      dVar16 = dVar16 + dVar17 * dVar17;
      lVar2 = lVar2 + 1;
      lVar9 = lVar9 + 0x100000000;
    } while (lVar2 < lVar1);
  }
  *var = dVar16 / (double)(int)rows;
  free(x_00);
  free(phi_00);
  free(__s);
  free(sig);
  free(col);
  free(C);
  free(C_00);
  free(ipiv);
  free(x_01);
  return;
}

Assistant:

void hralg(double *x, int N, int p,int q, double *phi,double *theta, double *var) {
	int m,i,t,pq,j,k;
	double wmean,sos;
	double *inp,*phim,*a,*z,*zt,*A,*b,*temp;
	int *ipiv;

	inp = (double*)malloc(sizeof(double)* N);

	if (p > q) {
		m = p;
	}
	else {
		m = q;
	}

	if (m < 10  && N > p+q+20) {
		m = 10;
	}
	else {
		m = m + 1;
	}

	pq = p + q;

	phim = (double*)malloc(sizeof(double)* m);
	a = (double*)malloc(sizeof(double)* N);
	z = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	zt = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	A = (double*)malloc(sizeof(double)* pq * pq);
	b = (double*)malloc(sizeof(double)* pq);
	temp = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	wmean = mean(x, N);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	// Estimate AR(m) coefficients

	ywalg(inp, N, m, phim);

	for (i = 0; i < N; ++i) {
		a[i] = 0.0;
	}

	for (t = m; t < N; ++t) {
		a[t] = inp[t];
		for (i = 0; i < m; ++i) {
			a[t] -= phim[i] * inp[t - i - 1];
		}
	}

	for (i = 0; i < N - m - q; ++i) {
		t = i * pq;
		for (j = 0; j < p; ++j) {
			z[t + j] = inp[m + q + i - j - 1];
		}

		for (k = 0; k < q; ++k) {
			z[t + p + k] = -a[m + q + i - k - 1];
		}
	}

	mtranspose(z, N - m - q, pq, zt);
	mmult(zt, z, A, pq, N - m - q, pq);
	mmult(zt, inp + m + q, b, pq, N - m - q, 1);


	ludecomp(A, pq, ipiv);
	linsolve(A, pq, b, ipiv, temp);

	for (i = 0; i < p; ++i) {
		phi[i] = temp[i];
	}

	for (i = p; i < pq; ++i) {
		theta[i-p] = temp[i];
	}
	sos = 0.0;
	for (t = m+q; t < N; ++t) {
		wmean = inp[t];
		for (i = 0; i < p; ++i) {
			wmean -= (phi[i] * inp[t - i - 1]);
		}

		for (i = 0; i < q; ++i) {
			wmean += (theta[i] * a[t - i - 1]);
		}

		sos += (wmean*wmean);
	}

	*var = sos / (N - m - q);

	free(inp);
	free(phim);
	free(a);
	free(z);
	free(zt);
	free(A);
	free(b);
	free(ipiv);
	free(temp);
}